

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_diffie_hellman_group_exchange_sha256_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  size_t *psVar1;
  uchar **ppuVar2;
  size_t sVar3;
  BIGNUM *a;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var4;
  LIBSSH2_COMP_METHOD *pLVar5;
  _func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  EVP_MD_CTX *ctx;
  int iVar11;
  uint uVar12;
  uint len;
  int iVar13;
  int iVar14;
  int iVar15;
  BIGNUM *pBVar16;
  BN_CTX *pBVar17;
  BIGNUM *pBVar18;
  uchar *puVar19;
  size_t sVar20;
  uchar *puVar21;
  LIBSSH2_CRYPT_METHOD *pLVar22;
  _LIBSSH2_MAC_METHOD *p_Var23;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  uchar *puVar27;
  EVP_MD_CTX *ctx_00;
  EVP_MD_CTX *hash;
  int local_54;
  EVP_MD_CTX *exchange_hash_ctx;
  int free_iv;
  int free_secret;
  uchar *local_40;
  void **local_38;
  
  if (key_state->state == libssh2_NB_state_idle) {
    pBVar16 = BN_new();
    key_state->p = (BIGNUM *)pBVar16;
    pBVar16 = BN_new();
    key_state->g = (BIGNUM *)pBVar16;
    key_state->request[0] = '\"';
    _libssh2_htonu32(key_state->request + 1,0x400);
    _libssh2_htonu32(key_state->request + 5,0x600);
    _libssh2_htonu32(key_state->request + 9,0x800);
    key_state->request_len = 0xd;
    key_state->state = libssh2_NB_state_created;
  }
  if (key_state->state == libssh2_NB_state_created) {
    iVar11 = _libssh2_transport_send
                       (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
    if (iVar11 == -0x25) {
      return -0x25;
    }
    if (iVar11 == 0) {
      key_state->state = libssh2_NB_state_sent;
      goto LAB_00120345;
    }
    pcVar24 = "Unable to send Group Exchange Request SHA256";
LAB_001205ba:
    iVar11 = _libssh2_error(session,iVar11,pcVar24);
    goto LAB_001215f1;
  }
LAB_00120345:
  if (key_state->state == libssh2_NB_state_sent) {
    iVar11 = _libssh2_packet_require
                       (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                        &key_state->req_state);
    if (iVar11 == -0x25) {
      return -0x25;
    }
    if (iVar11 != 0) {
      pcVar24 = "Timeout waiting for GEX_GROUP reply SHA256";
      goto LAB_001205ba;
    }
    key_state->state = libssh2_NB_state_sent1;
  }
  iVar11 = 0;
  if (key_state->state != libssh2_NB_state_sent1) goto LAB_001215f1;
  puVar19 = key_state->data;
  uVar12 = _libssh2_ntohu32(puVar19 + 1);
  BN_bin2bn(puVar19 + 5,uVar12,(BIGNUM *)key_state->p);
  len = _libssh2_ntohu32(puVar19 + (ulong)uVar12 + 5);
  BN_bin2bn(puVar19 + (ulong)uVar12 + 9,len,(BIGNUM *)key_state->g);
  pBVar16 = (BIGNUM *)key_state->p;
  local_40 = key_state->data;
  sVar3 = key_state->data_len;
  if ((key_state->exchange_state).state == libssh2_NB_state_idle) {
    a = (BIGNUM *)key_state->g;
    (key_state->exchange_state).k_value = (uchar *)0x0;
    (key_state->exchange_state).e_packet = (uchar *)0x0;
    (key_state->exchange_state).s_packet = (uchar *)0x0;
    pBVar17 = BN_CTX_new();
    (key_state->exchange_state).ctx = (BN_CTX *)pBVar17;
    pBVar18 = BN_new();
    (key_state->exchange_state).x = (BIGNUM *)pBVar18;
    pBVar18 = BN_new();
    (key_state->exchange_state).e = (BIGNUM *)pBVar18;
    pBVar18 = BN_new();
    (key_state->exchange_state).f = (BIGNUM *)pBVar18;
    pBVar18 = BN_new();
    (key_state->exchange_state).k = (BIGNUM *)pBVar18;
    *(undefined8 *)&(key_state->exchange_state).req_state = 0;
    (key_state->exchange_state).req_state.start = 0;
    BN_rand((BIGNUM *)(key_state->exchange_state).x,uVar12 * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)(key_state->exchange_state).e,a,(BIGNUM *)(key_state->exchange_state).x,
               pBVar16,(BN_CTX *)(key_state->exchange_state).ctx);
    iVar13 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
    iVar11 = iVar13 + 0xe;
    if (-1 < iVar13 + 7) {
      iVar11 = iVar13 + 7;
    }
    (key_state->exchange_state).e_packet_len = (long)((iVar11 >> 3) + 6);
    uVar12 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
    if ((uVar12 & 7) != 0) {
      psVar1 = &(key_state->exchange_state).e_packet_len;
      *psVar1 = *psVar1 - 1;
    }
    puVar19 = (uchar *)(*session->alloc)((key_state->exchange_state).e_packet_len,&session->abstract
                                        );
    (key_state->exchange_state).e_packet = puVar19;
    if (puVar19 != (uchar *)0x0) {
      *puVar19 = ' ';
      _libssh2_htonu32((key_state->exchange_state).e_packet + 1,
                       (int)(key_state->exchange_state).e_packet_len - 5);
      uVar12 = BN_num_bits((BIGNUM *)(key_state->exchange_state).e);
      lVar26 = 5;
      if ((uVar12 & 7) == 0) {
        (key_state->exchange_state).e_packet[5] = '\0';
        lVar26 = 6;
      }
      BN_bn2bin((BIGNUM *)(key_state->exchange_state).e,
                (key_state->exchange_state).e_packet + lVar26);
      (key_state->exchange_state).state = libssh2_NB_state_created;
      goto LAB_0012053b;
    }
    pcVar24 = "Out of memory error";
    goto LAB_001205de;
  }
LAB_0012053b:
  if ((key_state->exchange_state).state == libssh2_NB_state_created) {
    iVar11 = _libssh2_transport_send
                       (session,(key_state->exchange_state).e_packet,
                        (key_state->exchange_state).e_packet_len,(uchar *)0x0,0);
    if (iVar11 != -0x25) {
      if (iVar11 == 0) {
        (key_state->exchange_state).state = libssh2_NB_state_sent;
        goto LAB_0012056c;
      }
      pcVar24 = "Unable to send KEX init message";
      goto LAB_00120ee5;
    }
  }
  else {
LAB_0012056c:
    iVar13 = 0;
    if ((key_state->exchange_state).state == libssh2_NB_state_sent) {
      iVar13 = 0;
      if ((session->field_0x80 & 1) == 0) {
LAB_00120617:
        (key_state->exchange_state).state = libssh2_NB_state_sent1;
        goto LAB_0012061e;
      }
      iVar14 = _libssh2_packet_burn(session,&(key_state->exchange_state).burn_state);
      if (iVar14 == -0x25) {
        iVar15 = 1;
        iVar13 = 0;
      }
      else if (iVar14 < 1) {
        iVar15 = 2;
        iVar13 = iVar14;
      }
      else {
        session->field_0x80 = session->field_0x80 & 0xfe;
        iVar15 = 0;
        iVar13 = 0;
      }
      iVar11 = iVar13;
      if (iVar15 != 2) {
        iVar11 = iVar14;
        if (iVar15 != 0) goto LAB_001215de;
        goto LAB_00120617;
      }
    }
    else {
LAB_0012061e:
      if ((key_state->exchange_state).state == libssh2_NB_state_sent1) {
        iVar11 = _libssh2_packet_require
                           (session,'!',&(key_state->exchange_state).s_packet,
                            &(key_state->exchange_state).s_packet_len,0,(uchar *)0x0,0,
                            &(key_state->exchange_state).req_state);
        if (iVar11 == -0x25) goto LAB_001215de;
        if (iVar11 == 0) {
          puVar19 = (key_state->exchange_state).s_packet + 1;
          (key_state->exchange_state).s = puVar19;
          uVar12 = _libssh2_ntohu32(puVar19);
          session->server_hostkey_len = uVar12;
          ppuVar2 = &(key_state->exchange_state).s;
          *ppuVar2 = *ppuVar2 + 4;
          if (session->server_hostkey != (uchar *)0x0) {
            (*session->free)(session->server_hostkey,&session->abstract);
          }
          puVar19 = (uchar *)(*session->alloc)((ulong)session->server_hostkey_len,&session->abstract
                                              );
          session->server_hostkey = puVar19;
          if (puVar19 == (uchar *)0x0) {
            pcVar24 = "Unable to allocate memory for a copy of the host key";
LAB_001205de:
            iVar11 = -6;
          }
          else {
            local_54 = iVar13;
            memcpy(puVar19,(key_state->exchange_state).s,(ulong)session->server_hostkey_len);
            ppuVar2 = &(key_state->exchange_state).s;
            *ppuVar2 = *ppuVar2 + session->server_hostkey_len;
            iVar11 = _libssh2_md5_init(&exchange_hash_ctx);
            if (iVar11 != 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_md5,
                              (uint *)0x0);
              EVP_MD_CTX_free(exchange_hash_ctx);
            }
            session->server_hostkey_md5_valid = (uint)(iVar11 != 0);
            iVar11 = _libssh2_sha1_init(&exchange_hash_ctx);
            if (iVar11 != 0) {
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey_sha1,
                              (uint *)0x0);
              EVP_MD_CTX_free(exchange_hash_ctx);
            }
            session->server_hostkey_sha1_valid = (uint)(iVar11 != 0);
            iVar11 = (*session->hostkey->init)
                               (session,session->server_hostkey,(ulong)session->server_hostkey_len,
                                &session->server_hostkey_abstract);
            if (iVar11 == 0) {
              uVar12 = _libssh2_ntohu32((key_state->exchange_state).s);
              (key_state->exchange_state).f_value_len = (ulong)uVar12;
              puVar21 = (key_state->exchange_state).s;
              puVar19 = puVar21 + 4;
              (key_state->exchange_state).f_value = puVar19;
              (key_state->exchange_state).s = puVar21 + (ulong)uVar12 + 4;
              BN_bin2bn(puVar19,uVar12,(BIGNUM *)(key_state->exchange_state).f);
              uVar12 = _libssh2_ntohu32((key_state->exchange_state).s);
              (key_state->exchange_state).h_sig_len = (ulong)uVar12;
              puVar19 = (key_state->exchange_state).s + 4;
              (key_state->exchange_state).s = puVar19;
              (key_state->exchange_state).h_sig = puVar19;
              BN_mod_exp((BIGNUM *)(key_state->exchange_state).k,
                         (BIGNUM *)(key_state->exchange_state).f,
                         (BIGNUM *)(key_state->exchange_state).x,pBVar16,
                         (BN_CTX *)(key_state->exchange_state).ctx);
              iVar13 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
              iVar11 = iVar13 + 0xe;
              if (-1 < iVar13 + 7) {
                iVar11 = iVar13 + 7;
              }
              (key_state->exchange_state).k_value_len = (long)((iVar11 >> 3) + 5);
              uVar12 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
              if ((uVar12 & 7) != 0) {
                psVar1 = &(key_state->exchange_state).k_value_len;
                *psVar1 = *psVar1 - 1;
              }
              puVar19 = (uchar *)(*session->alloc)((key_state->exchange_state).k_value_len,
                                                   &session->abstract);
              (key_state->exchange_state).k_value = puVar19;
              if (puVar19 == (uchar *)0x0) {
                pcVar24 = "Unable to allocate buffer for K";
                goto LAB_001205de;
              }
              _libssh2_htonu32(puVar19,(int)(key_state->exchange_state).k_value_len - 4);
              uVar12 = BN_num_bits((BIGNUM *)(key_state->exchange_state).k);
              lVar26 = 4;
              if ((uVar12 & 7) == 0) {
                (key_state->exchange_state).k_value[4] = '\0';
                lVar26 = 5;
              }
              local_40 = local_40 + 1;
              local_38 = &session->server_hostkey_abstract;
              BN_bn2bin((BIGNUM *)(key_state->exchange_state).k,
                        (key_state->exchange_state).k_value + lVar26);
              (key_state->exchange_state).exchange_hash = &exchange_hash_ctx;
              _libssh2_sha256_init(&exchange_hash_ctx);
              puVar21 = (session->local).banner;
              puVar19 = (key_state->exchange_state).h_sig_comp;
              if (puVar21 == (uchar *)0x0) {
                _libssh2_htonu32(puVar19,0x15);
                EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
                pcVar24 = "SSH-2.0-libssh2_1.8.0";
                sVar20 = 0x15;
                ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
              }
              else {
                sVar20 = strlen((char *)puVar21);
                _libssh2_htonu32(puVar19,(int)sVar20 - 2);
                EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
                ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
                pcVar24 = (char *)(session->local).banner;
                sVar20 = strlen(pcVar24);
                sVar20 = sVar20 - 2;
              }
              EVP_DigestUpdate(ctx_00,pcVar24,sVar20);
              sVar20 = strlen((char *)(session->remote).banner);
              _libssh2_htonu32(puVar19,(uint32_t)sVar20);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
              ctx = exchange_hash_ctx;
              puVar21 = (session->remote).banner;
              sVar20 = strlen((char *)puVar21);
              EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar21,sVar20);
              _libssh2_htonu32(puVar19,(uint32_t)(session->local).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->local).kexinit,
                               (session->local).kexinit_len);
              _libssh2_htonu32(puVar19,(uint32_t)(session->remote).kexinit_len);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(session->remote).kexinit,
                               (session->remote).kexinit_len);
              _libssh2_htonu32(puVar19,session->server_hostkey_len);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,session->server_hostkey,
                               (ulong)session->server_hostkey_len);
              _libssh2_htonu32(puVar19,0x400);
              _libssh2_htonu32((key_state->exchange_state).h_sig_comp + 4,0x600);
              _libssh2_htonu32((key_state->exchange_state).h_sig_comp + 8,0x800);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,0xc);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,local_40,sVar3 - 1);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,
                               (key_state->exchange_state).e_packet + 1,
                               (key_state->exchange_state).e_packet_len - 1);
              _libssh2_htonu32(puVar19,(uint32_t)(key_state->exchange_state).f_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar19,4);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(key_state->exchange_state).f_value,
                               (key_state->exchange_state).f_value_len);
              EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(key_state->exchange_state).k_value,
                               (key_state->exchange_state).k_value_len);
              EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,puVar19,(uint *)0x0);
              EVP_MD_CTX_free(exchange_hash_ctx);
              iVar11 = (*session->hostkey->sig_verify)
                                 (session,(key_state->exchange_state).h_sig,
                                  (key_state->exchange_state).h_sig_len,puVar19,0x20,local_38);
              if (iVar11 == 0) {
                (key_state->exchange_state).c = '\x15';
                (key_state->exchange_state).state = libssh2_NB_state_sent2;
                iVar13 = local_54;
                goto LAB_00120be0;
              }
              pcVar24 = "Unable to verify hostkey signature";
              iVar11 = -0xb;
            }
            else {
              pcVar24 = "Unable to initialize hostkey importer";
              iVar11 = -10;
            }
          }
        }
        else {
          pcVar24 = "Timed out waiting for KEX reply";
          iVar11 = -9;
        }
LAB_00120ee5:
        iVar11 = _libssh2_error(session,iVar11,pcVar24);
      }
      else {
LAB_00120be0:
        if ((key_state->exchange_state).state == libssh2_NB_state_sent2) {
          iVar11 = _libssh2_transport_send(session,&(key_state->exchange_state).c,1,(uchar *)0x0,0);
          if (iVar11 == -0x25) goto LAB_001215de;
          if (iVar11 != 0) {
            pcVar24 = "Unable to send NEWKEYS message";
            goto LAB_00120ee5;
          }
          (key_state->exchange_state).state = libssh2_NB_state_sent3;
        }
        iVar11 = iVar13;
        if ((key_state->exchange_state).state == libssh2_NB_state_sent3) {
          ppuVar2 = &(key_state->exchange_state).tmp;
          local_54 = iVar13;
          iVar11 = _libssh2_packet_require
                             (session,'\x15',ppuVar2,&(key_state->exchange_state).tmp_len,0,
                              (uchar *)0x0,0,&(key_state->exchange_state).req_state);
          if (iVar11 == -0x25) goto LAB_001215de;
          if (iVar11 != 0) {
            pcVar24 = "Timed out waiting for NEWKEYS";
            goto LAB_00120ee5;
          }
          *(byte *)&session->state = (byte)session->state | 2;
          (*session->free)(*ppuVar2,&session->abstract);
          if (session->session_id == (uchar *)0x0) {
            puVar19 = (uchar *)(*session->alloc)(0x20,&session->abstract);
            session->session_id = puVar19;
            if (puVar19 == (uchar *)0x0) {
              pcVar24 = "Unable to allocate buffer for SHA digest";
              goto LAB_001205de;
            }
            uVar7 = *(undefined8 *)(key_state->exchange_state).h_sig_comp;
            uVar8 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 8);
            uVar9 = *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x18);
            *(undefined8 *)(puVar19 + 0x10) =
                 *(undefined8 *)((key_state->exchange_state).h_sig_comp + 0x10);
            *(undefined8 *)(puVar19 + 0x18) = uVar9;
            *(undefined8 *)puVar19 = uVar7;
            *(undefined8 *)(puVar19 + 8) = uVar8;
            session->session_id_len = 0x20;
          }
          p_Var4 = ((session->local).crypt)->dtor;
          if (p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var4)(session,&(session->local).crypt_abstract);
          }
          pLVar22 = (session->local).crypt;
          if (pLVar22->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            free_iv = 0;
            free_secret = 0;
            puVar19 = (uchar *)(*session->alloc)((long)pLVar22->iv_len + 0x20,&session->abstract);
            if (puVar19 == (uchar *)0x0) {
              local_54 = -1;
LAB_00120f13:
              bVar10 = false;
            }
            else {
              pLVar22 = (session->local).crypt;
              if (pLVar22->iv_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar21 = puVar19;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar21 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar19 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  pLVar22 = (session->local).crypt;
                } while (sVar20 < (ulong)(long)pLVar22->iv_len);
              }
              puVar21 = (uchar *)(*session->alloc)((long)pLVar22->secret_len + 0x20,
                                                   &session->abstract);
              if (puVar21 == (uchar *)0x0) {
LAB_00120f07:
                (*session->free)(puVar19,&session->abstract);
                local_54 = -5;
                goto LAB_00120f13;
              }
              pLVar22 = (session->local).crypt;
              if (pLVar22->secret_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar27 = puVar21;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar27 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar27,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar21 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  pLVar22 = (session->local).crypt;
                } while (sVar20 < (ulong)(long)pLVar22->secret_len);
              }
              iVar11 = (*pLVar22->init)(session,pLVar22,puVar19,&free_iv,puVar21,&free_secret,1,
                                        &(session->local).crypt_abstract);
              if (iVar11 != 0) {
                (*session->free)(puVar19,&session->abstract);
                puVar19 = puVar21;
                goto LAB_00120f07;
              }
              if (free_iv != 0) {
                memset(puVar19,0,(long)((session->local).crypt)->iv_len);
                (*session->free)(puVar19,&session->abstract);
              }
              bVar10 = true;
              if (free_secret != 0) {
                memset(puVar21,0,(long)((session->local).crypt)->secret_len);
                (*session->free)(puVar21,&session->abstract);
              }
            }
            iVar11 = local_54;
            if (!bVar10) goto LAB_0012152d;
          }
          p_Var4 = ((session->remote).crypt)->dtor;
          if (p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var4)(session,&(session->remote).crypt_abstract);
          }
          pLVar22 = (session->remote).crypt;
          if (pLVar22->init !=
              (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
               *)0x0) {
            free_iv = 0;
            free_secret = 0;
            puVar19 = (uchar *)(*session->alloc)((long)pLVar22->iv_len + 0x20,&session->abstract);
            if (puVar19 == (uchar *)0x0) {
LAB_0012114a:
              local_54 = -5;
              bVar10 = false;
            }
            else {
              pLVar22 = (session->remote).crypt;
              if (pLVar22->iv_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar21 = puVar19;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar21 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar19 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  pLVar22 = (session->remote).crypt;
                } while (sVar20 < (ulong)(long)pLVar22->iv_len);
              }
              puVar21 = (uchar *)(*session->alloc)((long)pLVar22->secret_len + 0x20,
                                                   &session->abstract);
              if (puVar21 == (uchar *)0x0) {
LAB_00121143:
                (*session->free)(puVar19,&session->abstract);
                goto LAB_0012114a;
              }
              pLVar22 = (session->remote).crypt;
              if (pLVar22->secret_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar27 = puVar21;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar27 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar27,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar21 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  pLVar22 = (session->remote).crypt;
                } while (sVar20 < (ulong)(long)pLVar22->secret_len);
              }
              iVar11 = (*pLVar22->init)(session,pLVar22,puVar19,&free_iv,puVar21,&free_secret,0,
                                        &(session->remote).crypt_abstract);
              if (iVar11 != 0) {
                (*session->free)(puVar19,&session->abstract);
                puVar19 = puVar21;
                goto LAB_00121143;
              }
              if (free_iv != 0) {
                memset(puVar19,0,(long)((session->remote).crypt)->iv_len);
                (*session->free)(puVar19,&session->abstract);
              }
              bVar10 = true;
              if (free_secret != 0) {
                memset(puVar21,0,(long)((session->remote).crypt)->secret_len);
                (*session->free)(puVar21,&session->abstract);
              }
            }
            iVar11 = local_54;
            if (!bVar10) goto LAB_0012152d;
          }
          p_Var4 = ((session->local).mac)->dtor;
          if (p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var4)(session,&(session->local).mac_abstract);
          }
          p_Var23 = (session->local).mac;
          if (p_Var23->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            free_iv = 0;
            puVar19 = (uchar *)(*session->alloc)((long)p_Var23->key_len + 0x20,&session->abstract);
            if (puVar19 == (uchar *)0x0) {
              local_54 = -5;
            }
            else {
              p_Var23 = (session->local).mac;
              if (p_Var23->key_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar21 = puVar19;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar21 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar19 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  p_Var23 = (session->local).mac;
                } while (sVar20 < (ulong)(long)p_Var23->key_len);
              }
              (*p_Var23->init)(session,puVar19,&free_iv,&(session->local).mac_abstract);
              if (free_iv != 0) {
                memset(puVar19,0,(long)((session->local).mac)->key_len);
                (*session->free)(puVar19,&session->abstract);
              }
            }
            iVar11 = local_54;
            if (puVar19 == (uchar *)0x0) goto LAB_0012152d;
          }
          p_Var4 = ((session->remote).mac)->dtor;
          if (p_Var4 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
            (*p_Var4)(session,&(session->remote).mac_abstract);
          }
          p_Var23 = (session->remote).mac;
          if (p_Var23->init != (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0)
          {
            free_iv = 0;
            puVar19 = (uchar *)(*session->alloc)((long)p_Var23->key_len + 0x20,&session->abstract);
            if (puVar19 == (uchar *)0x0) {
              local_54 = -5;
            }
            else {
              p_Var23 = (session->remote).mac;
              if (p_Var23->key_len != 0) {
                sVar20 = 0;
                do {
                  _libssh2_sha256_init(&hash);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).k_value,
                                   (key_state->exchange_state).k_value_len);
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,(key_state->exchange_state).h_sig_comp,0x20);
                  uVar25 = sVar20;
                  puVar21 = puVar19;
                  if (sVar20 == 0) {
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                    uVar25 = (ulong)session->session_id_len;
                    puVar21 = session->session_id;
                  }
                  EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar21,uVar25);
                  EVP_DigestFinal((EVP_MD_CTX *)hash,puVar19 + sVar20,(uint *)0x0);
                  EVP_MD_CTX_free(hash);
                  sVar20 = sVar20 + 0x20;
                  p_Var23 = (session->remote).mac;
                } while (sVar20 < (ulong)(long)p_Var23->key_len);
              }
              (*p_Var23->init)(session,puVar19,&free_iv,&(session->remote).mac_abstract);
              if (free_iv != 0) {
                memset(puVar19,0,(long)((session->remote).mac)->key_len);
                (*session->free)(puVar19,&session->abstract);
              }
            }
            iVar11 = local_54;
            if (puVar19 == (uchar *)0x0) goto LAB_0012152d;
          }
          pLVar5 = (session->local).comp;
          if ((pLVar5 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var6 = pLVar5->dtor, p_Var6 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var6)(session,1,&(session->local).comp_abstract);
          }
          pLVar5 = (session->local).comp;
          if ((pLVar5 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var6 = pLVar5->init, p_Var6 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar13 = (*p_Var6)(session,1,&(session->local).comp_abstract);
            iVar11 = -5;
            if (iVar13 != 0) goto LAB_0012152d;
          }
          pLVar5 = (session->remote).comp;
          if ((pLVar5 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var6 = pLVar5->dtor, p_Var6 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            (*p_Var6)(session,0,&(session->remote).comp_abstract);
          }
          iVar13 = local_54;
          pLVar5 = (session->remote).comp;
          iVar11 = iVar13;
          if ((pLVar5 != (LIBSSH2_COMP_METHOD *)0x0) &&
             (p_Var6 = pLVar5->init, p_Var6 != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0
             )) {
            iVar14 = (*p_Var6)(session,0,&(session->remote).comp_abstract);
            iVar11 = -5;
            if (iVar14 == 0) {
              iVar11 = iVar13;
            }
          }
        }
      }
    }
LAB_0012152d:
    BN_clear_free((BIGNUM *)(key_state->exchange_state).x);
    (key_state->exchange_state).x = (BIGNUM *)0x0;
    BN_clear_free((BIGNUM *)(key_state->exchange_state).e);
    (key_state->exchange_state).e = (BIGNUM *)0x0;
    BN_clear_free((BIGNUM *)(key_state->exchange_state).f);
    (key_state->exchange_state).f = (BIGNUM *)0x0;
    BN_clear_free((BIGNUM *)(key_state->exchange_state).k);
    (key_state->exchange_state).k = (BIGNUM *)0x0;
    BN_CTX_free((BN_CTX *)(key_state->exchange_state).ctx);
    (key_state->exchange_state).ctx = (BN_CTX *)0x0;
    puVar19 = (key_state->exchange_state).e_packet;
    if (puVar19 != (uchar *)0x0) {
      (*session->free)(puVar19,&session->abstract);
      (key_state->exchange_state).e_packet = (uchar *)0x0;
    }
    puVar19 = (key_state->exchange_state).s_packet;
    if (puVar19 != (uchar *)0x0) {
      (*session->free)(puVar19,&session->abstract);
      (key_state->exchange_state).s_packet = (uchar *)0x0;
    }
    puVar19 = (key_state->exchange_state).k_value;
    if (puVar19 != (uchar *)0x0) {
      (*session->free)(puVar19,&session->abstract);
      (key_state->exchange_state).k_value = (uchar *)0x0;
    }
    (key_state->exchange_state).state = libssh2_NB_state_idle;
  }
LAB_001215de:
  if (iVar11 == -0x25) {
    return -0x25;
  }
  (*session->free)(key_state->data,&session->abstract);
LAB_001215f1:
  key_state->state = libssh2_NB_state_idle;
  BN_clear_free((BIGNUM *)key_state->g);
  key_state->g = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)key_state->p);
  key_state->p = (BIGNUM *)0x0;
  return iVar11;
}

Assistant:

static int
kex_method_diffie_hellman_group_exchange_sha256_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    unsigned long p_len, g_len;
    int ret = 0;
    int rc;

    if (key_state->state == libssh2_NB_state_idle) {
        key_state->p = _libssh2_bn_init();
        key_state->g = _libssh2_bn_init();
        /* Ask for a P and G pair */
#ifdef LIBSSH2_DH_GEX_NEW
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_MINGROUP);
        _libssh2_htonu32(key_state->request + 5, LIBSSH2_DH_GEX_OPTGROUP);
        _libssh2_htonu32(key_state->request + 9, LIBSSH2_DH_GEX_MAXGROUP);
        key_state->request_len = 13;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange (New Method SHA256)");
#else
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST_OLD;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_OPTGROUP);
        key_state->request_len = 5;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange (Old Method SHA256)");
#endif

        key_state->state = libssh2_NB_state_created;
    }

    if (key_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send Group Exchange Request SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent;
    }

    if (key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_require(session, SSH_MSG_KEX_DH_GEX_GROUP,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for GEX_GROUP reply SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if (key_state->state == libssh2_NB_state_sent1) {
        unsigned char *s = key_state->data + 1;
        p_len = _libssh2_ntohu32(s);
        s += 4;
        _libssh2_bn_from_bin(key_state->p, p_len, s);
        s += p_len;

        g_len = _libssh2_ntohu32(s);
        s += 4;
        _libssh2_bn_from_bin(key_state->g, g_len, s);

        ret = diffie_hellman_sha256(session, key_state->g, key_state->p, p_len,
                                    SSH_MSG_KEX_DH_GEX_INIT,
                                    SSH_MSG_KEX_DH_GEX_REPLY,
                                    key_state->data + 1,
                                    key_state->data_len - 1,
                                    &key_state->exchange_state);
        if (ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

  dh_gex_clean_exit:
    key_state->state = libssh2_NB_state_idle;
    _libssh2_bn_free(key_state->g);
    key_state->g = NULL;
    _libssh2_bn_free(key_state->p);
    key_state->p = NULL;

    return ret;
}